

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_armor.cpp
# Opt level: O3

AInventory * __thiscall ABasicArmor::CreateCopy(ABasicArmor *this,AActor *other)

{
  int iVar1;
  AInventory *pAVar2;
  ulong uVar3;
  DVector3 local_28;
  
  local_28.X = 0.0;
  local_28.Y = 0.0;
  local_28.Z = 0.0;
  pAVar2 = (AInventory *)
           AActor::StaticSpawn((PClassActor *)RegistrationInfo.MyClass,&local_28,NO_REPLACE,false);
  uVar3 = -(ulong)(this->SavePercent != 0.0);
  pAVar2[1].super_AActor.super_DThinker.super_DObject._vptr_DObject =
       (_func_int **)(~uVar3 & 0x3fd5559b3d07c84b | (ulong)this->SavePercent & uVar3);
  iVar1 = (this->super_AArmor).super_AInventory.MaxAmount;
  pAVar2->Amount = (this->super_AArmor).super_AInventory.Amount;
  pAVar2->MaxAmount = iVar1;
  (pAVar2->Icon).texnum = (this->super_AArmor).super_AInventory.Icon.texnum;
  pAVar2[1].super_AActor.super_DThinker.super_DObject.ObjNext = *(DObject **)&this->BonusCount;
  *(int *)&pAVar2[1].super_AActor.super_DThinker.super_DObject.GCNext = this->ActualSaveAmount;
  (*(this->super_AArmor).super_AInventory.super_AActor.super_DThinker.super_DObject._vptr_DObject
    [0x36])(this);
  return pAVar2;
}

Assistant:

AInventory *ABasicArmor::CreateCopy (AActor *other)
{
	// BasicArmor that is in use is stored in the inventory as BasicArmor.
	// BasicArmor that is in reserve is not.
	ABasicArmor *copy = Spawn<ABasicArmor> ();
	copy->SavePercent = SavePercent != 0 ? SavePercent : 0.33335;	// slightly more than 1/3 to avoid roundoff errors.
	copy->Amount = Amount;
	copy->MaxAmount = MaxAmount;
	copy->Icon = Icon;
	copy->BonusCount = BonusCount;
	copy->ArmorType = ArmorType;
	copy->ActualSaveAmount = ActualSaveAmount;
	GoAwayAndDie ();
	return copy;
}